

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void print_stack_union(FILE *out,lemon *lemp,int *plineno)

{
  byte bVar1;
  symbol *psVar2;
  void *__s;
  size_t nElem;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *__s_00;
  ulong uVar6;
  char *pcVar7;
  ushort **ppuVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  byte *pbVar14;
  uint uVar15;
  byte *pbVar16;
  long lVar17;
  uint local_50;
  
  nElem = (long)lemp->nsymbol * 2;
  __s_00 = lemon_calloc(nElem,8);
  uVar6 = 0;
  uVar15 = (uint)nElem;
  uVar9 = 0;
  if (0 < (int)uVar15) {
    uVar9 = nElem & 0xffffffff;
  }
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined8 *)((long)__s_00 + uVar6 * 8) = 0;
  }
  uVar6 = 0;
  sVar13 = 0;
  if (lemp->vartype != (char *)0x0) {
    sVar13 = strlen(lemp->vartype);
  }
  uVar10 = (ulong)(uint)lemp->nsymbol;
  if (lemp->nsymbol < 1) {
    uVar10 = uVar6;
  }
  for (; uVar5 = (uint)sVar13, uVar10 != uVar6; uVar6 = uVar6 + 1) {
    pcVar7 = lemp->symbols[uVar6]->datatype;
    if (pcVar7 != (char *)0x0) {
      sVar13 = strlen(pcVar7);
      uVar3 = (uint)sVar13;
      if ((int)(uint)sVar13 < (int)uVar5) {
        uVar3 = uVar5;
      }
      sVar13 = (size_t)uVar3;
    }
  }
  pcVar7 = (char *)lemon_malloc((long)(int)(uVar5 * 2 + 1));
  local_50 = uVar15 | 1;
  lVar17 = 0;
  do {
    if (lemp->nsymbol <= lVar17) {
      pcVar11 = "Parse";
      if (lemp->name != (char *)0x0) {
        pcVar11 = lemp->name;
      }
      iVar4 = *plineno;
      fwrite("#[expect(non_camel_case_types)]\n",0x20,1,(FILE *)out);
      pcVar12 = "()";
      if (lemp->tokentype != (char *)0x0) {
        pcVar12 = lemp->tokentype;
      }
      fprintf((FILE *)out,"type %sTOKENTYPE<\'i> = %s;\n",pcVar11,pcVar12);
      fwrite("#[expect(non_camel_case_types)]\n",0x20,1,(FILE *)out);
      fwrite("enum YYMINORTYPE<\'i> {\n",0x17,1,(FILE *)out);
      fwrite("    yyinit(),\n",0xe,1,(FILE *)out);
      fprintf((FILE *)out,"    yy0(%sTOKENTYPE<\'i>),\n",pcVar11);
      iVar4 = iVar4 + 6;
      uVar6 = 0;
      while (uVar9 != uVar6) {
        lVar17 = uVar6 * 8;
        uVar6 = uVar6 + 1;
        if (*(long *)((long)__s_00 + lVar17) != 0) {
          fprintf((FILE *)out,"    yy%d(%s),\n",uVar6 & 0xffffffff);
          iVar4 = iVar4 + 1;
        }
      }
      psVar2 = lemp->errsym;
      if ((psVar2 != (symbol *)0x0) && (psVar2->useCnt != 0)) {
        fprintf((FILE *)out,"    yy%d(i32),\n",(ulong)(uint)psVar2->dtnum);
        iVar4 = iVar4 + 1;
      }
      memset(pcVar7,0,*(size_t *)(pcVar7 + -8));
      fwrite("}\n",2,1,(FILE *)out);
      fwrite("impl Default for YYMINORTYPE<\'_> {\n",0x23,1,(FILE *)out);
      fwrite("    fn default() -> Self {\n",0x1b,1,(FILE *)out);
      fwrite("        YYMINORTYPE::yyinit()\n",0x1e,1,(FILE *)out);
      fwrite("    }\n",6,1,(FILE *)out);
      fwrite("}\n",2,1,(FILE *)out);
      fwrite("impl<\'i> yyStackEntry<\'i> {\n",0x1c,1,(FILE *)out);
      fprintf((FILE *)out,"    fn yy0(self) -> %sTOKENTYPE<\'i> {\n",pcVar11);
      fwrite("        if let YYMINORTYPE::yy0(v) = self.minor {\n",0x32,1,(FILE *)out);
      fwrite("            v\n",0xe,1,(FILE *)out);
      fwrite("        } else {\n",0x11,1,(FILE *)out);
      fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
      fwrite("        }\n",10,1,(FILE *)out);
      fwrite("    }\n",6,1,(FILE *)out);
      iVar4 = iVar4 + 0xe;
      uVar6 = 0;
      while (uVar9 != uVar6) {
        lVar17 = uVar6 * 8;
        uVar6 = uVar6 + 1;
        if (*(long *)((long)__s_00 + lVar17) != 0) {
          fprintf((FILE *)out,"    fn yy%d(self) -> %s {\n",uVar6 & 0xffffffff);
          fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",
                  uVar6 & 0xffffffff);
          fwrite("            v\n",0xe,1,(FILE *)out);
          fwrite("        } else {\n",0x11,1,(FILE *)out);
          fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
          fwrite("        }\n",10,1,(FILE *)out);
          fwrite("    }\n",6,1,(FILE *)out);
          fwrite("    #[allow(dead_code)]\n",0x18,1,(FILE *)out);
          fprintf((FILE *)out,"    fn yy%d_ref(&mut self) -> &mut %s {\n",uVar6 & 0xffffffff,
                  *(undefined8 *)((long)__s_00 + uVar6 * 8 + -8));
          fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(ref mut v) = self.minor {\n",
                  uVar6 & 0xffffffff);
          fwrite("            v\n",0xe,1,(FILE *)out);
          fwrite("        } else {\n",0x11,1,(FILE *)out);
          fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
          fwrite("        }\n",10,1,(FILE *)out);
          fwrite("    }\n",6,1,(FILE *)out);
          iVar4 = iVar4 + 0xf;
          __s = *(void **)((long)__s_00 + uVar6 * 8 + -8);
          if (__s != (void *)0x0) {
            memset(__s,0,*(size_t *)((long)__s + -8));
          }
        }
      }
      memset(__s_00,0,*(size_t *)((long)__s_00 + -8));
      psVar2 = lemp->errsym;
      if ((psVar2 != (symbol *)0x0) && (psVar2->useCnt != 0)) {
        fprintf((FILE *)out,"    fn yy%d(self) -> i32 {\n",(ulong)(uint)psVar2->dtnum);
        fprintf((FILE *)out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",
                (ulong)(uint)lemp->errsym->dtnum);
        fwrite("            v\n",0xe,1,(FILE *)out);
        fwrite("        } else {\n",0x11,1,(FILE *)out);
        fwrite("            unreachable!()\n",0x1b,1,(FILE *)out);
        fwrite("        }\n",10,1,(FILE *)out);
        fwrite("    }\n",6,1,(FILE *)out);
        iVar4 = iVar4 + 7;
      }
      fwrite("}\n",2,1,(FILE *)out);
      *plineno = iVar4 + 1;
      return;
    }
    psVar2 = lemp->symbols[lVar17];
    if (psVar2 == lemp->errsym) {
      psVar2->dtnum = local_50;
    }
    else if ((psVar2->type == NONTERMINAL) &&
            ((pbVar14 = (byte *)psVar2->datatype, pbVar14 != (byte *)0x0 ||
             (pbVar14 = (byte *)lemp->vartype, pbVar14 != (byte *)0x0)))) {
      ppuVar8 = __ctype_b_loc();
      pbVar16 = pbVar14 + -1;
      do {
        pbVar14 = pbVar14 + 1;
        uVar6 = (ulong)pbVar16[1];
        pbVar16 = pbVar16 + 1;
      } while ((*(byte *)((long)*ppuVar8 + uVar6 * 2 + 1) & 0x20) != 0);
      uVar10 = 0;
      while ((char)uVar6 != '\0') {
        pcVar7[uVar10] = (char)uVar6;
        uVar10 = uVar10 + 1;
        bVar1 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        uVar6 = (ulong)bVar1;
      }
      for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
        if ((*(byte *)((long)*ppuVar8 + (ulong)(byte)pcVar7[(uVar10 & 0xffffffff) - 1] * 2 + 1) &
            0x20) == 0) goto LAB_0010a886;
      }
      uVar10 = 0;
LAB_0010a886:
      pcVar7[uVar10 & 0xffffffff] = '\0';
      if ((lemp->tokentype == (char *)0x0) || (iVar4 = strcmp(pcVar7,lemp->tokentype), iVar4 != 0))
      {
        uVar5 = 0;
        for (pcVar11 = pcVar7; *pcVar11 != '\0'; pcVar11 = pcVar11 + 1) {
          uVar5 = uVar5 * 0x35 + (int)*pcVar11;
        }
        uVar6 = ((ulong)uVar5 & 0xffffffff7fffffff) % (nElem & 0xffffffff);
        while( true ) {
          pcVar11 = *(char **)((long)__s_00 + uVar6 * 8);
          if (pcVar11 == (char *)0x0) break;
          iVar4 = strcmp(pcVar11,pcVar7);
          uVar5 = (int)uVar6 + 1;
          if (iVar4 == 0) {
            psVar2->dtnum = uVar5;
            goto LAB_0010a929;
          }
          if (uVar15 <= uVar5) {
            uVar5 = 0;
          }
          uVar6 = (ulong)uVar5;
        }
        psVar2->dtnum = (int)uVar6 + 1;
        sVar13 = strlen(pcVar7);
        pcVar11 = (char *)lemon_malloc((long)((int)sVar13 + 1));
        *(char **)((long)__s_00 + uVar6 * 8) = pcVar11;
        lemon_strcpy(pcVar11,pcVar7);
      }
      else {
        psVar2->dtnum = 0;
      }
    }
    else {
      psVar2->dtnum = 0;
    }
LAB_0010a929:
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno                /* Pointer to the line number */
){
  int lineno;               /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)lemon_calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)lemon_malloc( maxdtlength*2 + 1 );
  if( stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)lemon_malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      lemon_strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  fprintf(out,"#[expect(non_camel_case_types)]\n"); lineno++;
  fprintf(out,"type %sTOKENTYPE<'i> = %s;\n",name,
    lemp->tokentype?lemp->tokentype:"()");  lineno++;
  fprintf(out,"#[expect(non_camel_case_types)]\n"); lineno++;
  fprintf(out,"enum YYMINORTYPE<'i> {\n"); lineno++;
  fprintf(out,"    yyinit(),\n"); lineno++;
  fprintf(out,"    yy0(%sTOKENTYPE<'i>),\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"    yy%d(%s),\n",i+1,types[i]); lineno++;
//    lemon_free(types[i]);
  }
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"    yy%d(i32),\n",lemp->errsym->dtnum); lineno++;
  }
  lemon_free(stddt);
  fprintf(out,"}\n"); lineno++;

  fprintf(out,"impl Default for YYMINORTYPE<'_> {\n"); lineno++;
  fprintf(out,"    fn default() -> Self {\n"); lineno++;
  fprintf(out,"        YYMINORTYPE::yyinit()\n"); lineno++;
  fprintf(out,"    }\n"); lineno++;
  fprintf(out,"}\n"); lineno++;

  fprintf(out,"impl<'i> yyStackEntry<'i> {\n"); lineno++;
  fprintf(out,"    fn yy0(self) -> %sTOKENTYPE<'i> {\n",name); lineno++;
  fprintf(out,"        if let YYMINORTYPE::yy0(v) = self.minor {\n"); lineno++;
  fprintf(out,"            v\n"); lineno++;
  fprintf(out,"        } else {\n"); lineno++;
  fprintf(out,"            unreachable!()\n"); lineno++;
  fprintf(out,"        }\n"); lineno++;
  fprintf(out,"    }\n"); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"    fn yy%d(self) -> %s {\n",i+1,types[i]); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",i+1); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++; // TODO } else if YYMINORTYPE::yyinit() { return None;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
    fprintf(out,"    #[allow(dead_code)]\n"); lineno++; // TODO generates only when needed
    fprintf(out,"    fn yy%d_ref(&mut self) -> &mut %s {\n",i+1,types[i]); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(ref mut v) = self.minor {\n",i+1); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
    lemon_free(types[i]);
  }
  lemon_free(types);
  if( lemp->errsym && lemp->errsym->useCnt ){
    fprintf(out,"    fn yy%d(self) -> i32 {\n",lemp->errsym->dtnum); lineno++;
    fprintf(out,"        if let YYMINORTYPE::yy%d(v) = self.minor {\n",lemp->errsym->dtnum); lineno++;
    fprintf(out,"            v\n"); lineno++;
    fprintf(out,"        } else {\n"); lineno++;
    fprintf(out,"            unreachable!()\n"); lineno++;
    fprintf(out,"        }\n"); lineno++;
    fprintf(out,"    }\n"); lineno++;
  }
  fprintf(out,"}\n"); lineno++;

  *plineno = lineno;
}